

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNamedNodeMapImpl.cpp
# Opt level: O2

DOMNode * __thiscall
xercesc_4_0::DOMNamedNodeMapImpl::removeNamedItemNS
          (DOMNamedNodeMapImpl *this,XMLCh *namespaceURI,XMLCh *localName)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  DOMNodeImpl *pDVar6;
  DOMException *this_00;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long lVar7;
  DOMNode *pDVar8;
  ulong index;
  DOMNode *p;
  undefined8 *puVar9;
  
  bVar2 = readOnly(this);
  if (bVar2) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    puVar9 = &XMLPlatformUtils::fgMemoryManager;
    if (this->fOwnerNode != (DOMNode *)0x0) {
      iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var_05,iVar3) != 0) {
        iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        puVar9 = (undefined8 *)(CONCAT44(extraout_var_06,iVar3) + 0x158);
      }
    }
    DOMException::DOMException(this_00,7,0,(MemoryManager *)*puVar9);
  }
  else {
    for (lVar7 = 0; lVar7 != 0xc1; lVar7 = lVar7 + 1) {
      if (this->fBuckets[lVar7] != (DOMNodeVector *)0x0) {
        iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        uVar1 = this->fBuckets[lVar7]->nextFreeSlot;
        for (index = 0; uVar1 != index; index = index + 1) {
          if (index < this->fBuckets[lVar7]->nextFreeSlot) {
            p = this->fBuckets[lVar7]->data[index];
          }
          else {
            p = (DOMNode *)0x0;
          }
          iVar4 = (*p->_vptr_DOMNode[0x16])(p);
          iVar5 = (*p->_vptr_DOMNode[0x18])(p);
          bVar2 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_00,iVar4),namespaceURI);
          if (bVar2) {
            bVar2 = XMLString::equals(localName,(XMLCh *)CONCAT44(extraout_var_01,iVar5));
            if (bVar2) {
LAB_00280a9b:
              DOMNodeVector::removeElementAt(this->fBuckets[lVar7],index);
              pDVar8 = (DOMNode *)(CONCAT44(extraout_var,iVar3) + 0x18);
              if (CONCAT44(extraout_var,iVar3) == 0) {
                pDVar8 = (DOMNode *)0x0;
              }
              pDVar6 = castToNodeImpl(p);
              pDVar6->fOwnerNode = pDVar8;
              pDVar6 = castToNodeImpl(p);
              pDVar6->flags = pDVar6->flags & 0xfff7;
              return p;
            }
            if ((XMLCh *)CONCAT44(extraout_var_01,iVar5) == (XMLCh *)0x0) {
              iVar4 = (*p->_vptr_DOMNode[2])(p);
              bVar2 = XMLString::equals(localName,(XMLCh *)CONCAT44(extraout_var_02,iVar4));
              if (bVar2) goto LAB_00280a9b;
            }
          }
        }
      }
    }
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    puVar9 = &XMLPlatformUtils::fgMemoryManager;
    if (this->fOwnerNode != (DOMNode *)0x0) {
      iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var_03,iVar3) != 0) {
        iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        puVar9 = (undefined8 *)(CONCAT44(extraout_var_04,iVar3) + 0x158);
      }
    }
    DOMException::DOMException(this_00,8,0,(MemoryManager *)*puVar9);
  }
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMNode *DOMNamedNodeMapImpl::removeNamedItemNS(const XMLCh *namespaceURI,
                                                 const XMLCh *localName)
{
    if (this->readOnly())
        throw DOMException(
        DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNamedNodeMapMemoryManager);

    // the map is indexed using the full name of nodes; to search given a namespace and a local name
    // we have to do a linear search
    for (XMLSize_t index = 0; index < MAP_SIZE; index++) {
        if(fBuckets[index]==0)
            continue;

        DOMDocument *doc = fOwnerNode->getOwnerDocument();
        XMLSize_t i = 0;
        XMLSize_t size = fBuckets[index]->size();
        for (i = 0; i < size; ++i) {
            DOMNode *n=fBuckets[index]->elementAt(i);
            const XMLCh * nNamespaceURI = n->getNamespaceURI();
            const XMLCh * nLocalName = n->getLocalName();
            if (!XMLString::equals(nNamespaceURI, namespaceURI))    //URI not match
                continue;
            else {
                if (XMLString::equals(localName, nLocalName)
                    ||
                    (nLocalName == 0 && XMLString::equals(localName, n->getNodeName()))) {
                    fBuckets[index]->removeElementAt(i);
                    castToNodeImpl(n)->fOwnerNode = doc;
                    castToNodeImpl(n)->isOwned(false);
                    return n;
                }
            }
        }
    }
    throw DOMException(DOMException::NOT_FOUND_ERR, 0, GetDOMNamedNodeMapMemoryManager);
    return 0;
}